

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_22b41::testSetSampleCounts(Box2i *dataWindow)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  Box2i *pBVar8;
  ostream *poVar9;
  TypedDeepImageChannel<float> *pTVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  Rand48 random;
  float oldSamples [20];
  DeepImage img;
  ushort local_10e [3];
  DeepImageLevel *local_108;
  DeepImageLevel *local_100;
  Box2i *local_f8;
  ulong local_f0;
  string local_e8 [2];
  DeepImage local_98 [104];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"change sample counts, data window = (",0x25);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,") - (",5);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  Imf_3_2::DeepImage::DeepImage(local_98);
  Imf_3_2::Image::resize((Box *)local_98,(LevelMode)dataWindow,ROUND_DOWN);
  paVar1 = &local_e8[0].field_2;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"F","");
  Imf_3_2::Image::insertChannel((string *)local_98,(PixelType)local_e8,2,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_10e[0] = 0x5a5a;
  local_10e[1] = 0x5a5a;
  local_10e[2] = 0x5a5a;
  local_108 = (DeepImageLevel *)Imf_3_2::DeepImage::level((int)local_98);
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"F","");
  pTVar10 = Imf_3_2::DeepImageLevel::typedChannel<float>(local_108,local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(pTVar10 + 0x28) != 0) {
    local_100 = local_108 + 0x58;
    uVar16 = 0;
    local_f8 = dataWindow;
    do {
      pBVar8 = local_f8;
      iVar15 = (local_f8->min).x;
      lVar11 = Imath_3_2::nrand48(local_10e);
      iVar4 = *(int *)(pTVar10 + 0x1c);
      iVar5 = (pBVar8->min).y;
      lVar12 = Imath_3_2::nrand48(local_10e);
      iVar15 = iVar15 + (int)(lVar11 % (long)iVar4);
      uVar14 = iVar5 + (int)(lVar12 % (long)*(int *)(pTVar10 + 0x20));
      local_f0 = uVar16;
      Imf_3_2::ImageChannel::boundsCheck((int)local_100,iVar15);
      uVar6 = *(uint *)(*(long *)(local_108 + 0x90) +
                       (long)(int)(*(int *)(local_108 + 0x74) * uVar14 + iVar15) * 4);
      lVar11 = Imath_3_2::nrand48(local_10e);
      if (0 < (int)uVar6) {
        memcpy(local_e8,*(void **)(*(long *)(pTVar10 + 0x38) +
                                  (long)(int)(*(int *)(pTVar10 + 0x1c) * uVar14 + iVar15) * 8),
               (ulong)uVar6 * 4);
      }
      uVar16 = lVar11 + (lVar11 / 0x15) * -0x15 + (lVar11 / -0x5800000000000000) * 0x15;
      Imf_3_2::SampleCountChannel::set((int)local_100,iVar15,uVar14);
      if ((int)uVar6 < (int)uVar16) {
        if (0 < (int)uVar6) {
          uVar13 = 0;
          do {
            fVar3 = *(float *)(*(long *)(*(long *)(pTVar10 + 0x38) +
                                        (long)(int)(*(int *)(pTVar10 + 0x1c) * uVar14 + iVar15) * 8)
                              + uVar13 * 4);
            pfVar2 = (float *)((long)&local_e8[0]._M_dataplus._M_p + uVar13 * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("channel (x, y)[j] == oldSamples[j]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                            ,0x1ad,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)")
              ;
            }
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        if ((int)uVar6 < (int)uVar16) {
          uVar13 = (ulong)(int)uVar6;
          do {
            fVar3 = *(float *)(*(long *)(*(long *)(pTVar10 + 0x38) +
                                        (long)(int)(*(int *)(pTVar10 + 0x1c) * uVar14 + iVar15) * 8)
                              + uVar13 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              __assert_fail("channel (x, y)[j] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                            ,0x1b1,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)")
              ;
            }
            dVar7 = (double)Imath_3_2::erand48(local_10e);
            *(float *)(*(long *)(*(long *)(pTVar10 + 0x38) +
                                (long)(int)(*(int *)(pTVar10 + 0x1c) * uVar14 + iVar15) * 8) +
                      uVar13 * 4) = (float)dVar7;
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
        }
      }
      else if (0 < (long)uVar16) {
        uVar13 = 0;
        do {
          fVar3 = *(float *)(*(long *)(*(long *)(pTVar10 + 0x38) +
                                      (long)(int)(uVar14 * *(int *)(pTVar10 + 0x1c) + iVar15) * 8) +
                            uVar13 * 4);
          pfVar2 = (float *)((long)&local_e8[0]._M_dataplus._M_p + uVar13 * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("channel (x, y)[j] == oldSamples[j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x1b8,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
          }
          uVar13 = uVar13 + 1;
        } while ((uVar16 & 0xffffffff) != uVar13);
      }
      uVar16 = local_f0 + 1;
    } while (uVar16 < *(ulong *)(pTVar10 + 0x28));
  }
  Imf_3_2::DeepImage::~DeepImage(local_98);
  return;
}

Assistant:

void
testSetSampleCounts (const Box2i& dataWindow)
{
    cout << "change sample counts, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel&     level        = img.level ();
    DeepFloatChannel&   channel      = level.typedChannel<float> ("F");
    SampleCountChannel& sampleCounts = level.sampleCounts ();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels (); ++i)
    {
        int x = dataWindow.min.x + random.nexti () % channel.pixelsPerRow ();
        int y = dataWindow.min.y + random.nexti () % channel.pixelsPerColumn ();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti () % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];

        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel (x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel (x, y)[j] == 0);
                channel (x, y)[j] = random.nextf ();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);
        }
    }
}